

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::StartMouseMovingWindow(ImGuiWindow_conflict *window)

{
  ImGuiWindow_conflict *pIVar1;
  ImVec2 IVar2;
  bool bVar3;
  bool bVar4;
  ImGuiContext_conflict1 *pIVar5;
  
  pIVar5 = GImGui;
  FocusWindow(window);
  SetActiveID(window->MoveId,window);
  bVar4 = true;
  bVar3 = true;
  pIVar5->NavDisableHighlight = true;
  IVar2.y = (pIVar5->IO).MouseClickedPos[0].y - (window->RootWindowDockTree->Pos).y;
  IVar2.x = (pIVar5->IO).MouseClickedPos[0].x - (window->RootWindowDockTree->Pos).x;
  pIVar5->ActiveIdClickOffset = IVar2;
  pIVar5->ActiveIdNoClearOnFocusLoss = true;
  SetActiveIdUsingNavAndKeys();
  if (((window->Flags & 4) != 0) || ((window->RootWindowDockTree->Flags & 4) != 0)) {
    bVar4 = false;
    bVar3 = false;
  }
  if (((window->DockNodeAsHost != (ImGuiDockNode *)0x0) &&
      (pIVar1 = window->DockNodeAsHost->VisibleWindow, pIVar1 != (ImGuiWindow_conflict *)0x0)) &&
     (bVar3 = bVar4, (pIVar1->Flags & 4) != 0)) {
    bVar3 = false;
  }
  if (bVar3) {
    pIVar5->MovingWindow = window;
  }
  return;
}

Assistant:

void ImGui::StartMouseMovingWindow(ImGuiWindow* window)
{
    // Set ActiveId even if the _NoMove flag is set. Without it, dragging away from a window with _NoMove would activate hover on other windows.
    // We _also_ call this when clicking in a window empty space when io.ConfigWindowsMoveFromTitleBarOnly is set, but clear g.MovingWindow afterward.
    // This is because we want ActiveId to be set even when the window is not permitted to move.
    ImGuiContext& g = *GImGui;
    FocusWindow(window);
    SetActiveID(window->MoveId, window);
    g.NavDisableHighlight = true;
    g.ActiveIdClickOffset = g.IO.MouseClickedPos[0] - window->RootWindowDockTree->Pos;
    g.ActiveIdNoClearOnFocusLoss = true;
    SetActiveIdUsingNavAndKeys();

    bool can_move_window = true;
    if ((window->Flags & ImGuiWindowFlags_NoMove) || (window->RootWindowDockTree->Flags & ImGuiWindowFlags_NoMove))
        can_move_window = false;
    if (ImGuiDockNode* node = window->DockNodeAsHost)
        if (node->VisibleWindow && (node->VisibleWindow->Flags & ImGuiWindowFlags_NoMove))
            can_move_window = false;
    if (can_move_window)
        g.MovingWindow = window;
}